

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processInitRequest(CommonCore *this,ActionMessage *cmd)

{
  bool bVar1;
  action_t aVar2;
  int iVar3;
  pointer pBVar4;
  ActionMessage *in_RSI;
  CommonCore *in_RDI;
  anon_class_8_1_ba1d3c9a unaff_retaddr;
  MessageProcessingResult res;
  FederateState *fed;
  FilterFederate *in_stack_00000160;
  BaseTimeCoordinator *in_stack_000001a0;
  ActionMessage *in_stack_00000228;
  CommonCore *in_stack_00000230;
  ActionMessage *in_stack_00000418;
  TranslatorFederate *in_stack_00000420;
  CommonCore *in_stack_00000440;
  ActionMessage *in_stack_00000528;
  FilterFederate *in_stack_00000530;
  BrokerState in_stack_ffffffffffffff8c;
  BrokerState in_stack_ffffffffffffff8e;
  BrokerBase *in_stack_ffffffffffffff90;
  GlobalFederateId local_50;
  char local_49;
  ActionMessage *local_48;
  ActionMessage *local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  GlobalFederateId in_stack_ffffffffffffffd4;
  GlobalFederateId local_20;
  BaseType local_1c;
  FederateState *local_18;
  ActionMessage *local_10;
  CommonCore *this_00;
  
  local_10 = in_RSI;
  this_00 = in_RDI;
  aVar2 = ActionMessage::action(in_RSI);
  if (aVar2 == cmd_init) {
    local_1c = (local_10->source_id).gid;
    local_18 = getFederateCore((CommonCore *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               in_stack_ffffffffffffffd4);
    if (local_18 != (FederateState *)0x0) {
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_ffffffffffffff90,
                 SUB21((ushort)in_stack_ffffffffffffff8e >> 8,0));
      bVar1 = allInitReady(this_00);
      if (bVar1) {
        bVar1 = BrokerBase::transitionBrokerState
                          (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,
                           in_stack_ffffffffffffff8c);
        if (bVar1) {
          bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_RDI);
          if (bVar1) {
            setActionFlag<helics::ActionMessage,helics::TimingFlags>
                      (local_10,iteration_requested_flag);
          }
          else {
            checkDependencies(in_stack_00000440);
          }
          GlobalFederateId::GlobalFederateId
                    (&local_20,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid
                    );
          (local_10->source_id).gid = local_20.gid;
          (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,local_10);
        }
        else {
          bVar1 = checkActionFlag<helics::ActionMessage,bool>
                            (local_10,(bool)((in_RDI->super_BrokerBase).observer & 1));
          if ((bVar1) || (((in_RDI->super_BrokerBase).dynamicFederation & 1U) != 0)) {
            GlobalFederateId::GlobalFederateId
                      ((GlobalFederateId *)&stack0xffffffffffffffd4,
                       (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
            (local_10->source_id).gid = in_stack_ffffffffffffffd4.gid;
            (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,local_10);
          }
        }
      }
    }
  }
  else if (aVar2 == cmd_init_grant) {
    bVar1 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>
                      (local_10,iteration_requested_flag);
    if (bVar1) {
      bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_RDI);
      if (bVar1) {
        std::atomic<bool>::store
                  ((atomic<bool> *)in_RDI,SUB81((ulong)in_stack_ffffffffffffff90 >> 0x38,0),
                   (memory_order)in_stack_ffffffffffffff90);
        bVar1 = BrokerBase::transitionBrokerState
                          (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,
                           in_stack_ffffffffffffff8c);
        if (bVar1) {
          local_40 = local_10;
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>
          ::apply<helics::CommonCore::processInitRequest(helics::ActionMessage&)::__0>
                    ((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                      *)this_00,unaff_retaddr);
        }
        else {
          bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                            (local_10,observer_flag);
          if ((bVar1) ||
             (bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                                (local_10,dynamic_join_flag), bVar1)) {
            routeMessage(in_stack_00000230,in_stack_00000228);
          }
        }
      }
    }
    else {
      bVar1 = BrokerBase::transitionBrokerState
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,
                         in_stack_ffffffffffffff8c);
      if (bVar1) {
        if (in_RDI->filterFed != (FilterFederate *)0x0) {
          FilterFederate::organizeFilterOperations(in_stack_00000160);
        }
        local_48 = local_10;
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>::
        apply<helics::CommonCore::processInitRequest(helics::ActionMessage&)::__1>
                  ((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                    *)this_00,unaff_retaddr);
        if ((in_RDI->filterFed != (FilterFederate *)0x0) &&
           (((in_RDI->filterTiming & 1U) != 0 || (((in_RDI->super_BrokerBase).globalTime & 1U) != 0)
            ))) {
          FilterFederate::handleMessage(in_stack_00000530,in_stack_00000528);
        }
        if (in_RDI->translatorFed != (TranslatorFederate *)0x0) {
          TranslatorFederate::handleMessage(in_stack_00000420,in_stack_00000418);
        }
        pBVar4 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x56ca28);
        (*pBVar4->_vptr_BaseTimeCoordinator[10])();
        pBVar4 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x56ca48);
        memset(&local_50,0,4);
        GlobalFederateId::GlobalFederateId(&local_50);
        iVar3 = (*pBVar4->_vptr_BaseTimeCoordinator[9])(pBVar4,(ulong)(uint)local_50.gid);
        local_49 = (char)iVar3;
        if (local_49 == '\0') {
          (in_RDI->super_BrokerBase).enteredExecutionMode = true;
        }
        CLI::std::
        unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
        operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                    *)0x56caa3);
        bVar1 = BaseTimeCoordinator::hasActiveTimeDependencies((BaseTimeCoordinator *)0x56caab);
        if (!bVar1) {
          CLI::std::
          unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
          ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                        *)0x56cac4);
          BaseTimeCoordinator::disconnect(in_stack_000001a0);
        }
      }
      else {
        bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                          (local_10,observer_flag);
        if ((bVar1) ||
           (bVar1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                              (local_10,dynamic_join_flag), bVar1)) {
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>
          ::apply<helics::CommonCore::processInitRequest(helics::ActionMessage&)::__2>
                    ((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                      *)this_00,unaff_retaddr);
        }
      }
    }
  }
  return;
}

Assistant:

void CommonCore::processInitRequest(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_INIT: {
            auto* fed = getFederateCore(cmd.source_id);
            if (fed == nullptr) {
                break;
            }

            fed->init_transmitted = true;

            if (allInitReady()) {
                if (transitionBrokerState(BrokerState::CONNECTED,
                                          BrokerState::INITIALIZING)) {  // make sure we only
                    // do this once
                    if (initIterations) {
                        setActionFlag(cmd, iteration_requested_flag);
                    } else {
                        checkDependencies();
                    }
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, cmd);
                } else if (checkActionFlag(cmd, observer) || dynamicFederation) {
                    cmd.source_id = global_broker_id_local;
                    transmit(parent_route_id, cmd);
                }
            }

        } break;
        case CMD_INIT_GRANT:
            if (checkActionFlag(cmd, iteration_requested_flag)) {
                if (initIterations) {
                    initIterations.store(false);
                    if (transitionBrokerState(BrokerState::INITIALIZING, BrokerState::CONNECTED)) {
                        loopFederates.apply([&cmd](auto& fed) {
                            if (fed->initIterating.load()) {
                                fed->initIterating.store(false);
                                fed->init_transmitted = false;
                                fed->addAction(cmd);
                            }
                        });
                    } else if (checkActionFlag(cmd, observer_flag) ||
                               checkActionFlag(cmd, dynamic_join_flag)) {
                        routeMessage(cmd);
                    }
                }
            } else {
                if (transitionBrokerState(
                        BrokerState::INITIALIZING,
                        BrokerState::OPERATING)) {  // forward the grant to all federates
                    if (filterFed != nullptr) {
                        filterFed->organizeFilterOperations();
                    }

                    loopFederates.apply([&cmd](auto& fed) { fed->addAction(cmd); });
                    if (filterFed != nullptr && (filterTiming || globalTime)) {
                        filterFed->handleMessage(cmd);
                    }
                    if (translatorFed != nullptr) {
                        translatorFed->handleMessage(cmd);
                    }
                    timeCoord->enteringExecMode();
                    auto res = timeCoord->checkExecEntry();
                    if (res == MessageProcessingResult::NEXT_STEP) {
                        enteredExecutionMode = true;
                    }
                    if (!timeCoord->hasActiveTimeDependencies()) {
                        timeCoord->disconnect();
                    }
                } else if (checkActionFlag(cmd, observer_flag) ||
                           checkActionFlag(cmd, dynamic_join_flag)) {
                    loopFederates.apply([&cmd](auto& fed) {
                        if (fed->getState() == FederateStates::CREATED) {
                            fed->addAction(cmd);
                        }
                    });
                }
            }

            break;
        default:
            break;
    }
}